

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Group_Type.cxx
# Opt level: O1

void __thiscall Fl_Group_Type::write_code2(Fl_Group_Type *this)

{
  uchar uVar1;
  char *pcVar2;
  char *pcVar3;
  
  pcVar2 = (this->super_Fl_Widget_Type).super_Fl_Type.name_;
  pcVar3 = "o";
  if (pcVar2 != (char *)0x0) {
    pcVar3 = pcVar2;
  }
  Fl_Widget_Type::write_extra_code(&this->super_Fl_Widget_Type);
  pcVar2 = indent();
  write_c("%s%s->end();\n",pcVar2,pcVar3);
  uVar1 = Fl_Widget_Type::resizable(&this->super_Fl_Widget_Type);
  if (uVar1 != '\0') {
    pcVar2 = indent();
    write_c("%sFl_Group::current()->resizable(%s);\n",pcVar2,pcVar3);
  }
  Fl_Widget_Type::write_block_close(&this->super_Fl_Widget_Type);
  return;
}

Assistant:

void Fl_Group_Type::write_code2() {
  const char *var = name() ? name() : "o";
  write_extra_code();
  write_c("%s%s->end();\n", indent(), var);
  if (resizable()) {
    write_c("%sFl_Group::current()->resizable(%s);\n", indent(), var);
  }
  write_block_close();
}